

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O2

uint64_t SipHashUint256(uint64_t k0,uint64_t k1,uint256 *val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  
  uVar1 = *(ulong *)(val->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(ulong *)((val->super_base_blob<256U>).m_data._M_elems + 8);
  uVar7 = *(ulong *)((val->super_base_blob<256U>).m_data._M_elems + 0x10);
  uVar3 = *(ulong *)((val->super_base_blob<256U>).m_data._M_elems + 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar5 = k1 ^ 0x646f72616e646f6d;
    uVar8 = (k0 ^ 0x736f6d6570736575) + uVar5;
    uVar6 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar8;
    uVar4 = k1 ^ 0x7465646279746573 ^ uVar1;
    uVar5 = (k0 ^ 0x6c7967656e657261) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar6;
    uVar6 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar5;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar8;
    uVar8 = uVar8 + uVar6;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar8;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar9 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar6;
    uVar6 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar5;
    uVar8 = (uVar1 ^ uVar9) + uVar6;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar8;
    uVar4 = uVar9 ^ uVar2 ^ (uVar4 << 0x15 | uVar4 >> 0x2b);
    uVar1 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar1;
    uVar8 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar4;
    uVar1 = uVar1 + uVar6;
    uVar5 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar1;
    uVar6 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar8;
    uVar8 = uVar8 + uVar5;
    uVar4 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar8;
    uVar5 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar6;
    uVar9 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar5;
    uVar6 = (uVar8 << 0x20 | uVar8 >> 0x20) + uVar9;
    uVar5 = uVar5 + uVar4;
    uVar4 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar5;
    uVar1 = (uVar2 ^ uVar6) + uVar4;
    uVar4 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar1;
    uVar6 = uVar6 ^ uVar7 ^ (uVar9 << 0x15 | uVar9 >> 0x2b);
    uVar2 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar6;
    uVar6 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar2;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar6;
    uVar2 = uVar2 + uVar4;
    uVar5 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar2;
    uVar4 = (uVar6 << 0x15 | uVar6 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar6 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar2;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar6;
    uVar2 = uVar2 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar2;
    uVar4 = (uVar7 ^ uVar1) + uVar5;
    uVar7 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar4;
    uVar1 = uVar1 ^ uVar3 ^ (uVar6 << 0x15 | uVar6 >> 0x2b);
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar2;
    uVar6 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar1;
    uVar2 = uVar2 + uVar7;
    uVar7 = (uVar7 << 0x11 | uVar7 >> 0x2f) ^ uVar2;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar6;
    uVar6 = uVar6 + uVar7;
    uVar4 = (uVar7 << 0xd | uVar7 >> 0x33) ^ uVar6;
    uVar5 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar2 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar5;
    uVar7 = (uVar6 << 0x20 | uVar6 >> 0x20) + uVar2;
    uVar5 = uVar5 + uVar4;
    uVar4 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar5;
    uVar1 = (uVar3 ^ uVar7) + uVar4;
    uVar7 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar7;
    uVar4 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar1;
    uVar2 = uVar7 ^ 0x2000000000000000;
    uVar3 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar2;
    uVar2 = (uVar7 << 0x10 | uVar2 >> 0x30) ^ uVar3;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar3 = uVar3 + uVar4;
    uVar7 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar3;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar7;
    uVar5 = (uVar7 << 0xd | uVar7 >> 0x33) ^ uVar1;
    uVar7 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar7;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar7 = uVar7 + uVar5;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar3 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar7;
    uVar1 = (uVar1 ^ 0x2000000000000000) + uVar3;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar1;
    uVar7 = ((uVar7 << 0x20 | uVar7 >> 0x20) ^ 0xff) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar7;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar7 = uVar7 + uVar3;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar7;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar3;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar1;
    uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar7;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar7 = uVar7 + uVar3;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar7;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar3;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar1;
    uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar7;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar7 = uVar7 + uVar3;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar7;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar7;
    uVar1 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar1 + uVar3;
    uVar7 = uVar7 + uVar1;
    return (uVar7 << 0x20 | uVar7 >> 0x20) ^ (uVar1 << 0x11 | uVar1 >> 0x2f) ^
           (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar7;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t SipHashUint256(uint64_t k0, uint64_t k1, const uint256& val)
{
    /* Specialized implementation for efficiency */
    uint64_t d = val.GetUint64(0);

    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ d;

    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(1);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(2);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(3);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    v3 ^= (uint64_t{4}) << 59;
    SIPROUND;
    SIPROUND;
    v0 ^= (uint64_t{4}) << 59;
    v2 ^= 0xFF;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    return v0 ^ v1 ^ v2 ^ v3;
}